

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QMenu::hideTearOffMenu(QMenu *this)

{
  QWeakPointer<QObject> *this_00;
  long lVar1;
  bool bVar2;
  int in_ESI;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  this_00 = (QWeakPointer<QObject> *)(lVar1 + 0x318);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (bVar2) {
    QWidget::close(*(QWidget **)(lVar1 + 800),in_ESI);
    QWeakPointer<QObject>::assign<QObject>(this_00,(QObject *)0x0);
    return;
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }